

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

Type * __thiscall
soul::heart::Parser::parseVectorOrArrayTypeSuffixes
          (Type *__return_storage_ptr__,Parser *this,PrimitiveType *elementType)

{
  ArraySize size;
  bool bVar1;
  PrimitiveType local_94;
  CompileMessage local_90;
  Type local_58;
  Type local_40;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x263773);
  local_58.primitiveType = (PrimitiveType)elementType->type;
  if (bVar1) {
    if (((bool_ < local_58.primitiveType.type) ||
        ((0x39cU >> (local_58.primitiveType.type & 0x1f) & 1) == 0)) &&
       (1 < local_58.primitiveType.type - complex32)) {
      CompileMessageHelpers::createMessage<>
                (&local_90,syntax,error,"Cannot create an array with this element type");
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_90);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.description._M_dataplus._M_p != &local_90.description.field_2) {
        operator_delete(local_90.description._M_dataplus._M_p,
                        local_90.description.field_2._M_allocated_capacity + 1);
      }
    }
    size = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).literalIntValue;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x26369e);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x289596);
    if (0xff < size - 1) {
      CompileMessageHelpers::createMessage<>(&local_90,syntax,error,"Illegal vector size");
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_90);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.description._M_dataplus._M_p != &local_90.description.field_2) {
        operator_delete(local_90.description._M_dataplus._M_p,
                        local_90.description.field_2._M_allocated_capacity + 1);
      }
    }
    local_94 = (PrimitiveType)elementType->type;
    Type::createVector(&local_40,&local_94,size);
    parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_40);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
  }
  else {
    local_58.category = local_58.primitiveType.type != invalid;
    local_58.arrayElementCategory = invalid;
    local_58.isRef = false;
    local_58.isConstant = false;
    local_58.boundingSize = 0;
    local_58.arrayElementBoundingSize = 0;
    local_58.structure.object = (Structure *)0x0;
    parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_58);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseVectorOrArrayTypeSuffixes (PrimitiveType elementType)
    {
        if (matchIf (HEARTOperator::lessThan))
        {
            if (! elementType.canBeVectorElementType())
                throwError (Errors::wrongTypeForArrayElement());

            auto size = parseLiteralInt();
            expect (HEARTOperator::greaterThan);

            if (! Type::isLegalVectorSize (size))
                throwError (Errors::illegalVectorSize());

            return parseArrayTypeSuffixes (Type::createVector (elementType, static_cast<Type::ArraySize> (size)));
        }

        return parseArrayTypeSuffixes (elementType);
    }